

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynBase * ParseClassDefinition(ParseContext *ctx)

{
  Lexeme *begin;
  IntrusiveList<SynIdentifier> aliases_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  SynAlign *align_00;
  SynIdentifier *pSVar4;
  Lexeme *pLVar5;
  SynClassElements *elements_00;
  Lexeme *pLVar6;
  InplaceStr IVar7;
  SynClassElements *elements;
  TraceScope traceScope;
  SynBase *local_c0;
  SynBase *baseClass;
  bool extendable;
  InplaceStr alias;
  IntrusiveList<SynIdentifier> aliases;
  InplaceStr name;
  SynIdentifier *nameIdentifier;
  SynAlign *align;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  align_00 = ParseAlign(ctx);
  bVar1 = ParseContext::Consume(ctx,lex_class);
  if (bVar1) {
    bVar1 = anon_unknown.dwarf_11716f::CheckAt(ctx,lex_string,"ERROR: class name expected");
    if (bVar1) {
      IVar7 = ParseContext::Consume(ctx);
      name.end = (char *)ParseContext::get<SynIdentifier>(ctx);
      pLVar6 = ParseContext::Previous(ctx);
      pLVar5 = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier((SynIdentifier *)name.end,pLVar6,pLVar5,IVar7);
    }
    else {
      name.end = (char *)ParseContext::get<SynIdentifier>(ctx);
      InplaceStr::InplaceStr((InplaceStr *)&aliases.tail);
      SynIdentifier::SynIdentifier((SynIdentifier *)name.end,stack0xffffffffffffffa0);
    }
    bVar1 = ParseContext::Consume(ctx,lex_semicolon);
    if (bVar1) {
      if (align_00 != (SynAlign *)0x0) {
        pLVar6 = ParseContext::Current(ctx);
        anon_unknown.dwarf_11716f::Report
                  (ctx,pLVar6,"ERROR: can\'t specify alignment of a class prototype");
      }
      ctx_local = (ParseContext *)ParseContext::get<SynClassPrototype>(ctx);
      pLVar6 = ParseContext::Previous(ctx);
      SynClassPrototype::SynClassPrototype
                ((SynClassPrototype *)ctx_local,begin,pLVar6,(SynIdentifier *)name.end);
    }
    else {
      IntrusiveList<SynIdentifier>::IntrusiveList((IntrusiveList<SynIdentifier> *)&alias.end);
      bVar1 = ParseContext::Consume(ctx,lex_less);
      if (bVar1) {
        bVar1 = anon_unknown.dwarf_11716f::CheckAt
                          (ctx,lex_string,"ERROR: generic type alias required after \'<\'");
        if (bVar1) {
          IVar7 = ParseContext::Consume(ctx);
          pSVar4 = ParseContext::get<SynIdentifier>(ctx);
          pLVar6 = ParseContext::Previous(ctx);
          pLVar5 = ParseContext::Previous(ctx);
          SynIdentifier::SynIdentifier(pSVar4,pLVar6,pLVar5,IVar7);
          IntrusiveList<SynIdentifier>::push_back((IntrusiveList<SynIdentifier> *)&alias.end,pSVar4)
          ;
          while ((bVar1 = ParseContext::Consume(ctx,lex_comma), bVar1 &&
                 (bVar1 = anon_unknown.dwarf_11716f::CheckAt
                                    (ctx,lex_string,"ERROR: generic type alias required after \',\'"
                                    ), bVar1))) {
            IVar7 = ParseContext::Consume(ctx);
            pSVar4 = ParseContext::get<SynIdentifier>(ctx);
            pLVar6 = ParseContext::Previous(ctx);
            pLVar5 = ParseContext::Previous(ctx);
            SynIdentifier::SynIdentifier(pSVar4,pLVar6,pLVar5,IVar7);
            IntrusiveList<SynIdentifier>::push_back
                      ((IntrusiveList<SynIdentifier> *)&alias.end,pSVar4);
          }
        }
        anon_unknown.dwarf_11716f::CheckConsume
                  (ctx,lex_greater,"ERROR: \'>\' expected after generic type alias list");
      }
      bVar1 = ParseContext::Consume(ctx,lex_extendable);
      local_c0 = (SynBase *)0x0;
      bVar2 = ParseContext::Consume(ctx,lex_colon);
      if ((bVar2) && (local_c0 = ParseType(ctx,(bool *)0x0,false), local_c0 == (SynBase *)0x0)) {
        pLVar6 = ParseContext::Current(ctx);
        anon_unknown.dwarf_11716f::Report
                  (ctx,pLVar6,"ERROR: base type name is expected at this point");
      }
      anon_unknown.dwarf_11716f::CheckConsume
                (ctx,lex_ofigure,"ERROR: \'{\' not found after class name");
      if ((ParseClassDefinition(ParseContext&)::token == '\0') &&
         (iVar3 = __cxa_guard_acquire(&ParseClassDefinition(ParseContext&)::token), iVar3 != 0)) {
        ParseClassDefinition::token = NULLC::TraceGetToken("parse","ParseClassBody");
        __cxa_guard_release(&ParseClassDefinition(ParseContext&)::token);
      }
      NULLC::TraceScope::TraceScope((TraceScope *)&elements,ParseClassDefinition::token);
      if (name.end != (char *)0x0) {
        NULLC::TraceLabel(*(char **)(name.end + 0x40),*(char **)(name.end + 0x48));
      }
      elements_00 = ParseClassElements(ctx);
      anon_unknown.dwarf_11716f::CheckConsume
                (ctx,lex_cfigure,"ERROR: \'}\' not found after class definition");
      ctx_local = (ParseContext *)ParseContext::get<SynClassDefinition>(ctx);
      pLVar6 = ParseContext::Previous(ctx);
      aliases_00.tail = aliases.head;
      aliases_00.head = (SynIdentifier *)alias.end;
      SynClassDefinition::SynClassDefinition
                ((SynClassDefinition *)ctx_local,begin,pLVar6,align_00,(SynIdentifier *)name.end,
                 aliases_00,bVar1,local_c0,elements_00);
      NULLC::TraceScope::~TraceScope((TraceScope *)&elements);
    }
  }
  else {
    ctx->currentLexeme = begin;
    ctx_local = (ParseContext *)0x0;
  }
  return (SynBase *)ctx_local;
}

Assistant:

SynBase* ParseClassDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	SynAlign *align = ParseAlign(ctx);

	if(ctx.Consume(lex_class))
	{
		SynIdentifier *nameIdentifier = NULL;

		if(CheckAt(ctx, lex_string, "ERROR: class name expected"))
		{
			InplaceStr name = ctx.Consume();
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
		}
		else
		{
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
		}

		if(ctx.Consume(lex_semicolon))
		{
			if(align)
				Report(ctx, ctx.Current(), "ERROR: can't specify alignment of a class prototype");

			return new (ctx.get<SynClassPrototype>()) SynClassPrototype(start, ctx.Previous(), nameIdentifier);
		}

		IntrusiveList<SynIdentifier> aliases;

		if(ctx.Consume(lex_less))
		{
			if(CheckAt(ctx, lex_string, "ERROR: generic type alias required after '<'"))
			{
				InplaceStr alias = ctx.Consume();

				aliases.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), alias));

				while(ctx.Consume(lex_comma))
				{
					if(!CheckAt(ctx, lex_string, "ERROR: generic type alias required after ','"))
						break;

					alias = ctx.Consume();

					aliases.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), alias));
				}
			}

			CheckConsume(ctx, lex_greater, "ERROR: '>' expected after generic type alias list");
		}

		bool extendable = ctx.Consume(lex_extendable);

		SynBase *baseClass = NULL;

		if(ctx.Consume(lex_colon))
		{
			baseClass = ParseType(ctx);

			if(!baseClass)
				Report(ctx, ctx.Current(), "ERROR: base type name is expected at this point");
		}

		CheckConsume(ctx, lex_ofigure, "ERROR: '{' not found after class name");

		TRACE_SCOPE("parse", "ParseClassBody");

		if(nameIdentifier)
			TRACE_LABEL2(nameIdentifier->name.begin, nameIdentifier->name.end);

		SynClassElements *elements = ParseClassElements(ctx);

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after class definition");

		return new (ctx.get<SynClassDefinition>()) SynClassDefinition(start, ctx.Previous(), align, nameIdentifier, aliases, extendable, baseClass, elements);
	}

	// Backtrack
	ctx.currentLexeme = start;

	return NULL;
}